

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_model_add_class_word(ngram_model_t *model,char *classname,char *word,float32 weight)

{
  int *piVar1;
  ngram_class_t *lmclass;
  int32 iVar2;
  int iVar3;
  char *fmt;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double p;
  
  iVar2 = ngram_wid(model,classname);
  if (iVar2 == -1) {
    fmt = "No such word or class tag: %s\n";
    lVar6 = 0x318;
  }
  else {
    for (uVar5 = 0; model->n_classes != uVar5; uVar5 = uVar5 + 1) {
      if (model->classes[uVar5]->tag_wid == iVar2) {
        if (model->n_classes != uVar5) {
          lmclass = model->classes[uVar5];
          iVar2 = ngram_add_word_internal(model,word,(int32)uVar5);
          if (iVar2 == -1) {
            return -1;
          }
          p = (double)((float)weight / (float)(lmclass->n_words + lmclass->n_hash_inuse + 1));
          iVar3 = logmath_log(model->lmath,(float64)(1.0 - p));
          for (lVar6 = 0; lVar6 < lmclass->n_words; lVar6 = lVar6 + 1) {
            lmclass->prob1[lVar6] = lmclass->prob1[lVar6] + iVar3;
          }
          uVar4 = 0;
          uVar5 = (ulong)(uint)lmclass->n_hash;
          if (lmclass->n_hash < 1) {
            uVar5 = uVar4;
          }
          for (; uVar5 * 0xc - uVar4 != 0; uVar4 = uVar4 + 0xc) {
            if (*(int *)((long)&lmclass->nword_hash->wid + uVar4) != -1) {
              piVar1 = (int *)((long)&lmclass->nword_hash->prob1 + uVar4);
              *piVar1 = *piVar1 + iVar3;
            }
          }
          iVar3 = logmath_log(model->lmath,(float64)p);
          iVar2 = ngram_class_add_word(lmclass,iVar2,iVar3);
          return iVar2;
        }
        break;
      }
    }
    fmt = "Word %s is not a class tag (call ngram_model_add_class() first)\n";
    lVar6 = 0x323;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
          ,lVar6,fmt,classname);
  return -1;
}

Assistant:

int32
ngram_model_add_class_word(ngram_model_t * model,
                           const char *classname,
                           const char *word, float32 weight)
{
    ngram_class_t *lmclass;
    int32 classid, tag_wid, wid, i, scale;
    float32 fprob;

    /* Find the class corresponding to classname.  Linear search
     * probably okay here since there won't be very many classes, and
     * this doesn't have to be fast. */
    tag_wid = ngram_wid(model, classname);
    if (tag_wid == NGRAM_INVALID_WID) {
        E_ERROR("No such word or class tag: %s\n", classname);
        return tag_wid;
    }
    for (classid = 0; classid < model->n_classes; ++classid) {
        if (model->classes[classid]->tag_wid == tag_wid)
            break;
    }
    /* Hmm, no such class.  It's probably not a good idea to create one. */
    if (classid == model->n_classes) {
        E_ERROR
            ("Word %s is not a class tag (call ngram_model_add_class() first)\n",
             classname);
        return NGRAM_INVALID_WID;
    }
    lmclass = model->classes[classid];

    /* Add this word to the model's set of words. */
    wid = ngram_add_word_internal(model, word, classid);
    if (wid == NGRAM_INVALID_WID)
        return wid;

    /* This is the fixed probability of the new word. */
    fprob = weight * 1.0f / (lmclass->n_words + lmclass->n_hash_inuse + 1);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(model->lmath, 1.0 - fprob);
    for (i = 0; i < lmclass->n_words; ++i)
        lmclass->prob1[i] += scale;
    for (i = 0; i < lmclass->n_hash; ++i)
        if (lmclass->nword_hash[i].wid != -1)
            lmclass->nword_hash[i].prob1 += scale;

    /* Now add it to the class hash table. */
    return ngram_class_add_word(lmclass, wid,
                                logmath_log(model->lmath, fprob));
}